

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O0

void LoadReverbPreset(char *name,ALeffect *effect)

{
  int iVar1;
  long in_RSI;
  char *in_RDI;
  EFXEAXREVERBPROPERTIES *props;
  anon_struct_140_2_2091dbc6 *reverbitem;
  anon_struct_140_2_2091dbc6 *__end1;
  anon_struct_140_2_2091dbc6 *__begin1;
  anon_struct_140_2_2091dbc6 (*__range1) [113];
  ALenum in_stack_000000ac;
  ALeffect *in_stack_000000b0;
  anon_struct_140_2_2091dbc6 *local_20;
  
  iVar1 = al::strcasecmp(in_RDI,"NONE");
  if (iVar1 == 0) {
    anon_unknown.dwarf_1c62b::InitEffectParams(in_stack_000000b0,in_stack_000000ac);
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Loading reverb \'%s\'\n","NONE");
    }
  }
  else {
    if ((DisabledEffects[0] & 1U) == 0) {
      anon_unknown.dwarf_1c62b::InitEffectParams(in_stack_000000b0,in_stack_000000ac);
    }
    else if ((DisabledEffects[1] & 1U) == 0) {
      anon_unknown.dwarf_1c62b::InitEffectParams(in_stack_000000b0,in_stack_000000ac);
    }
    else {
      anon_unknown.dwarf_1c62b::InitEffectParams(in_stack_000000b0,in_stack_000000ac);
    }
    for (local_20 = reverblist; local_20 != (anon_struct_140_2_2091dbc6 *)"Generating %d effects";
        local_20 = local_20 + 1) {
      iVar1 = al::strcasecmp(in_RDI,local_20->name);
      if (iVar1 == 0) {
        if (2 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (II) Loading reverb \'%s\'\n",local_20);
        }
        *(float *)(in_RSI + 4) = (local_20->props).flDensity;
        *(float *)(in_RSI + 8) = (local_20->props).flDiffusion;
        *(float *)(in_RSI + 0xc) = (local_20->props).flGain;
        *(float *)(in_RSI + 0x10) = (local_20->props).flGainHF;
        *(float *)(in_RSI + 0x38) = (local_20->props).flGainLF;
        *(float *)(in_RSI + 0x14) = (local_20->props).flDecayTime;
        *(float *)(in_RSI + 0x18) = (local_20->props).flDecayHFRatio;
        *(float *)(in_RSI + 0x3c) = (local_20->props).flDecayLFRatio;
        *(float *)(in_RSI + 0x1c) = (local_20->props).flReflectionsGain;
        *(float *)(in_RSI + 0x20) = (local_20->props).flReflectionsDelay;
        *(float *)(in_RSI + 0x40) = (local_20->props).flReflectionsPan[0];
        *(float *)(in_RSI + 0x44) = (local_20->props).flReflectionsPan[1];
        *(float *)(in_RSI + 0x48) = (local_20->props).flReflectionsPan[2];
        *(float *)(in_RSI + 0x24) = (local_20->props).flLateReverbGain;
        *(float *)(in_RSI + 0x28) = (local_20->props).flLateReverbDelay;
        *(float *)(in_RSI + 0x4c) = (local_20->props).flLateReverbPan[0];
        *(float *)(in_RSI + 0x50) = (local_20->props).flLateReverbPan[1];
        *(float *)(in_RSI + 0x54) = (local_20->props).flLateReverbPan[2];
        *(float *)(in_RSI + 0x58) = (local_20->props).flEchoTime;
        *(float *)(in_RSI + 0x5c) = (local_20->props).flEchoDepth;
        *(float *)(in_RSI + 0x60) = (local_20->props).flModulationTime;
        *(float *)(in_RSI + 100) = (local_20->props).flModulationDepth;
        *(float *)(in_RSI + 0x2c) = (local_20->props).flAirAbsorptionGainHF;
        *(float *)(in_RSI + 0x68) = (local_20->props).flHFReference;
        *(float *)(in_RSI + 0x6c) = (local_20->props).flLFReference;
        *(float *)(in_RSI + 0x30) = (local_20->props).flRoomRolloffFactor;
        *(bool *)(in_RSI + 0x34) = (local_20->props).iDecayHFLimit != 0;
        return;
      }
    }
    if (1 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Reverb preset \'%s\' not found\n",in_RDI);
    }
  }
  return;
}

Assistant:

void LoadReverbPreset(const char *name, ALeffect *effect)
{
    if(al::strcasecmp(name, "NONE") == 0)
    {
        InitEffectParams(effect, AL_EFFECT_NULL);
        TRACE("Loading reverb '%s'\n", "NONE");
        return;
    }

    if(!DisabledEffects[EAXREVERB_EFFECT])
        InitEffectParams(effect, AL_EFFECT_EAXREVERB);
    else if(!DisabledEffects[REVERB_EFFECT])
        InitEffectParams(effect, AL_EFFECT_REVERB);
    else
        InitEffectParams(effect, AL_EFFECT_NULL);
    for(const auto &reverbitem : reverblist)
    {
        const EFXEAXREVERBPROPERTIES *props;

        if(al::strcasecmp(name, reverbitem.name) != 0)
            continue;

        TRACE("Loading reverb '%s'\n", reverbitem.name);
        props = &reverbitem.props;
        effect->Props.Reverb.Density   = props->flDensity;
        effect->Props.Reverb.Diffusion = props->flDiffusion;
        effect->Props.Reverb.Gain   = props->flGain;
        effect->Props.Reverb.GainHF = props->flGainHF;
        effect->Props.Reverb.GainLF = props->flGainLF;
        effect->Props.Reverb.DecayTime    = props->flDecayTime;
        effect->Props.Reverb.DecayHFRatio = props->flDecayHFRatio;
        effect->Props.Reverb.DecayLFRatio = props->flDecayLFRatio;
        effect->Props.Reverb.ReflectionsGain   = props->flReflectionsGain;
        effect->Props.Reverb.ReflectionsDelay  = props->flReflectionsDelay;
        effect->Props.Reverb.ReflectionsPan[0] = props->flReflectionsPan[0];
        effect->Props.Reverb.ReflectionsPan[1] = props->flReflectionsPan[1];
        effect->Props.Reverb.ReflectionsPan[2] = props->flReflectionsPan[2];
        effect->Props.Reverb.LateReverbGain   = props->flLateReverbGain;
        effect->Props.Reverb.LateReverbDelay  = props->flLateReverbDelay;
        effect->Props.Reverb.LateReverbPan[0] = props->flLateReverbPan[0];
        effect->Props.Reverb.LateReverbPan[1] = props->flLateReverbPan[1];
        effect->Props.Reverb.LateReverbPan[2] = props->flLateReverbPan[2];
        effect->Props.Reverb.EchoTime  = props->flEchoTime;
        effect->Props.Reverb.EchoDepth = props->flEchoDepth;
        effect->Props.Reverb.ModulationTime  = props->flModulationTime;
        effect->Props.Reverb.ModulationDepth = props->flModulationDepth;
        effect->Props.Reverb.AirAbsorptionGainHF = props->flAirAbsorptionGainHF;
        effect->Props.Reverb.HFReference = props->flHFReference;
        effect->Props.Reverb.LFReference = props->flLFReference;
        effect->Props.Reverb.RoomRolloffFactor = props->flRoomRolloffFactor;
        effect->Props.Reverb.DecayHFLimit = props->iDecayHFLimit ? AL_TRUE : AL_FALSE;
        return;
    }

    WARN("Reverb preset '%s' not found\n", name);
}